

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall CoreML::Specification::AdamOptimizer::SharedDtor(AdamOptimizer *this)

{
  ulong uVar1;
  DoubleParameter *pDVar2;
  Int64Parameter *this_00;
  LogMessage *other;
  undefined8 *puVar3;
  LogFinisher local_51;
  LogMessage local_50;
  
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  puVar3 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar3 = (undefined8 *)*puVar3;
  }
  if (puVar3 != (undefined8 *)0x0) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O1/mlmodel/format/NeuralNetwork.pb.cc"
               ,0xed22);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: GetArenaForAllocation() == nullptr: ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  if (this != (AdamOptimizer *)_AdamOptimizer_default_instance_) {
    pDVar2 = this->learningrate_;
    if (pDVar2 != (DoubleParameter *)0x0) {
      DoubleParameter::~DoubleParameter(pDVar2);
      operator_delete(pDVar2,0x28);
    }
    if (this != (AdamOptimizer *)_AdamOptimizer_default_instance_) {
      this_00 = this->minibatchsize_;
      if (this_00 != (Int64Parameter *)0x0) {
        Int64Parameter::~Int64Parameter(this_00);
        operator_delete(this_00,0x28);
      }
      if (this != (AdamOptimizer *)_AdamOptimizer_default_instance_) {
        pDVar2 = this->beta1_;
        if (pDVar2 != (DoubleParameter *)0x0) {
          DoubleParameter::~DoubleParameter(pDVar2);
          operator_delete(pDVar2,0x28);
        }
        if (this != (AdamOptimizer *)_AdamOptimizer_default_instance_) {
          pDVar2 = this->beta2_;
          if (pDVar2 != (DoubleParameter *)0x0) {
            DoubleParameter::~DoubleParameter(pDVar2);
            operator_delete(pDVar2,0x28);
          }
          if ((this != (AdamOptimizer *)_AdamOptimizer_default_instance_) &&
             (pDVar2 = this->eps_, pDVar2 != (DoubleParameter *)0x0)) {
            DoubleParameter::~DoubleParameter(pDVar2);
            operator_delete(pDVar2,0x28);
          }
        }
      }
    }
  }
  return;
}

Assistant:

inline void AdamOptimizer::SharedDtor() {
  GOOGLE_DCHECK(GetArenaForAllocation() == nullptr);
  if (this != internal_default_instance()) delete learningrate_;
  if (this != internal_default_instance()) delete minibatchsize_;
  if (this != internal_default_instance()) delete beta1_;
  if (this != internal_default_instance()) delete beta2_;
  if (this != internal_default_instance()) delete eps_;
}